

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O2

void PHYSFS_freeList(void *list)

{
  undefined8 *puVar1;
  
  puVar1 = (undefined8 *)list;
  if (list == (void *)0x0) {
    return;
  }
  for (; (void *)*puVar1 != (void *)0x0; puVar1 = puVar1 + 1) {
    (*__PHYSFS_AllocatorHooks.Free)((void *)*puVar1);
  }
  (*__PHYSFS_AllocatorHooks.Free)(list);
  return;
}

Assistant:

void PHYSFS_freeList(void *list)
{
    void **i;
    if (list != NULL)
    {
        for (i = (void **) list; *i != NULL; i++)
            allocator.Free(*i);

        allocator.Free(list);
    } /* if */
}